

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.cpp
# Opt level: O2

void getB64SignatureForHash(char *sigb64,uint8_t *privateKey,uint8_t *hash,size_t length)

{
  uECC_Curve curve;
  uint8_t signature [64];
  
  do {
    curve = uECC_secp256k1();
    uECC_sign(privateKey,hash,(uint)length,signature,curve);
  } while (0x79 < signature[0x20]);
  Base64Class::encode((Base64Class *)&Base64,sigb64,(char *)signature,0x40);
  return;
}

Assistant:

void getB64SignatureForHash(char * sigb64, const uint8_t * privateKey, const uint8_t * hash,size_t length){

	uint8_t signature[64];
	do {
		uECC_sign(privateKey, hash, length, signature, uECC_secp256k1());
//		FEED_WATCHDOG;
	} while (signature[32] > 0x79);//hub would refuse a high-s signature
	Base64.encode(sigb64, (char *) signature, 64);

}